

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O3

constructor constructor_create(size_t count,class_visibility_id visibility)

{
  constructor __ptr;
  set psVar1;
  set *ppsVar2;
  
  __ptr = (constructor)malloc(count * 0x18 + 0x18);
  if (__ptr != (constructor)0x0) {
    psVar1 = set_create(hash_callback_str,comparable_callback_str);
    __ptr->map = psVar1;
    if (psVar1 != (set)0x0) {
      __ptr->count = count;
      if (count != 0) {
        ppsVar2 = &__ptr[1].map;
        do {
          *(undefined8 *)(ppsVar2 + -1) = 0xffffffffffffffff;
          *ppsVar2 = (set)0x0;
          ppsVar2[1] = (set)0x0;
          ppsVar2 = ppsVar2 + 3;
          count = count - 1;
        } while (count != 0);
      }
      __ptr->visibility = visibility;
      return __ptr;
    }
    log_write_impl_va("metacall",0x59,"constructor_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_constructor.c"
                      ,LOG_LEVEL_ERROR,"Invalid constructor set allocation");
    free(__ptr);
  }
  return (constructor)0x0;
}

Assistant:

constructor constructor_create(size_t count, enum class_visibility_id visibility)
{
	constructor ctor = malloc(sizeof(struct constructor_type) + sizeof(struct constructor_node_type) * count);

	if (ctor != NULL)
	{
		size_t index;

		ctor->map = set_create(&hash_callback_str, &comparable_callback_str);

		if (ctor->map == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid constructor set allocation");

			free(ctor);

			return NULL;
		}

		ctor->count = count;

		for (index = 0; index < count; ++index)
		{
			constructor_node node = constructor_at(ctor, index);

			if (node != NULL)
			{
				node->index = REFLECT_CONSTRUCTOR_INVALID_INDEX;
				node->name = NULL;
				node->t = NULL;
			}
		}

		ctor->visibility = visibility;

		return ctor;
	}

	return NULL;
}